

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
adios2::helper::CommImplMPI::Win_allocate_shared
          (CommImplMPI *this,size_t size,int disp_unit,void *baseptr,string *hint)

{
  undefined8 uVar1;
  pointer pCVar2;
  undefined4 in_ECX;
  unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_> *in_RDX
  ;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type in_R8;
  string *in_stack_00000068;
  int in_stack_00000074;
  MPI_Aint asize;
  unique_ptr<adios2::helper::CommWinImplMPI,_std::default_delete<adios2::helper::CommWinImplMPI>_> w
  ;
  pointer in_stack_ffffffffffffff08;
  CommWinImplMPI *in_stack_ffffffffffffff10;
  unique_ptr<adios2::helper::CommWinImplMPI,_std::default_delete<adios2::helper::CommWinImplMPI>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  unique_ptr<adios2::helper::CommWinImplMPI,_std::default_delete<adios2::helper::CommWinImplMPI>_>
  local_98;
  string local_90 [32];
  string local_70 [32];
  unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
  *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
  *local_18;
  
  __rhs = in_RDI;
  local_38.field_2._M_allocated_capacity = in_R8;
  local_38.field_2._12_4_ = in_ECX;
  local_18 = in_RDX;
  operator_new(0x10);
  CommWinImplMPI::CommWinImplMPI(in_stack_ffffffffffffff10);
  __lhs = &local_38;
  std::
  unique_ptr<adios2::helper::CommWinImplMPI,std::default_delete<adios2::helper::CommWinImplMPI>>::
  unique_ptr<std::default_delete<adios2::helper::CommWinImplMPI>,void>
            ((unique_ptr<adios2::helper::CommWinImplMPI,_std::default_delete<adios2::helper::CommWinImplMPI>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_50 = local_18;
  uVar1 = *(undefined8 *)(in_RSI + 8);
  pCVar2 = std::
           unique_ptr<adios2::helper::CommWinImplMPI,_std::default_delete<adios2::helper::CommWinImplMPI>_>
           ::operator->((unique_ptr<adios2::helper::CommWinImplMPI,_std::default_delete<adios2::helper::CommWinImplMPI>_>
                         *)0x1a25f0);
  MPI_Win_allocate_shared
            (local_18,local_38.field_2._12_4_,&ompi_mpi_info_null,uVar1,
             local_38.field_2._M_allocated_capacity,&pCVar2->m_Win);
  std::operator+(in_RSI,__rhs);
  std::operator+(__lhs,(char *)in_stack_ffffffffffffff10);
  anon_unknown_1::CheckMPIReturn(in_stack_00000074,in_stack_00000068);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  this_00 = &local_98;
  std::unique_ptr<adios2::helper::CommWinImpl,std::default_delete<adios2::helper::CommWinImpl>>::
  unique_ptr<adios2::helper::CommWinImplMPI,std::default_delete<adios2::helper::CommWinImplMPI>,void>
            (local_18,(unique_ptr<adios2::helper::CommWinImplMPI,_std::default_delete<adios2::helper::CommWinImplMPI>_>
                       *)__lhs);
  adios2::helper::CommImpl::MakeWin(in_RDI,this_00);
  std::unique_ptr<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>::
  ~unique_ptr(local_18);
  std::
  unique_ptr<adios2::helper::CommWinImplMPI,_std::default_delete<adios2::helper::CommWinImplMPI>_>::
  ~unique_ptr(this_00);
  return __rhs;
}

Assistant:

Comm::Win CommImplMPI::Win_allocate_shared(size_t size, int disp_unit, void *baseptr,
                                           const std::string &hint) const
{
    auto w = std::unique_ptr<CommWinImplMPI>(new CommWinImplMPI());
    MPI_Aint asize = static_cast<MPI_Aint>(size);
    CheckMPIReturn(
        MPI_Win_allocate_shared(asize, disp_unit, MPI_INFO_NULL, m_MPIComm, baseptr, &w->m_Win),
        "in call to Win_allocate_shared " + hint + "\n");
    return MakeWin(std::move(w));
}